

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Fire_PDU::Fire_PDU(Fire_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Fire_PDU *this_local;
  
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_003304f8;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Location);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  (*(this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Fire_PDU::Fire_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}